

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

string * arm::format_bb_name_abi_cxx11_(string_view func_name,uint32_t bb_id)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *this;
  uint in_ECX;
  string *in_RDI;
  stringstream name;
  string *psVar2;
  char *in_stack_fffffffffffffe30;
  stringstream local_1a8 [396];
  uint local_1c;
  
  psVar2 = in_RDI;
  local_1c = in_ECX;
  std::__cxx11::stringstream::stringstream(local_1a8);
  __str._M_str = in_stack_fffffffffffffe30;
  __str._M_len = (size_t)psVar2;
  pbVar1 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_RDI,__str);
  this = std::operator<<(pbVar1,"_$bb");
  std::ostream::operator<<(this,local_1c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return psVar2;
}

Assistant:

std::string format_bb_name(std::string_view func_name, uint32_t bb_id) {
  std::stringstream name;
  name << func_name << "_$bb" << bb_id;
  return name.str();
}